

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O0

HighsInt __thiscall StabilizerOrbits::orbitalFixing(StabilizerOrbits *this,HighsDomain *domain)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *pvVar5;
  size_type sVar6;
  reference pvVar7;
  size_type sVar8;
  Reason in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  HighsDomain *in_stack_00000030;
  HighsSymmetries *in_stack_00000038;
  HighsInt newFixed;
  HighsInt j_2;
  HighsInt j_1;
  size_type oldSize;
  HighsInt oldNumFixed;
  HighsInt j;
  HighsInt fixcol;
  HighsInt i;
  HighsInt numOrbits;
  HighsInt numFixed;
  HighsDomain *in_stack_000001e8;
  undefined4 in_stack_ffffffffffffff58;
  value_type in_stack_ffffffffffffff5c;
  HighsDomain *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  Reason in_stack_ffffffffffffff70;
  int local_48;
  int local_3c;
  int local_2c;
  int local_28;
  int local_24;
  int local_1c;
  HighsInt local_4;
  
  local_1c = HighsSymmetries::propagateOrbitopes(in_stack_00000038,in_stack_00000030);
  bVar2 = HighsDomain::infeasible((HighsDomain *)in_RSI);
  local_4 = local_1c;
  if ((!bVar2) &&
     (bVar2 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff60), !bVar2)) {
    sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RDI + 1);
    for (local_24 = 0; iVar1 = local_1c, local_24 < (int)sVar3 + -1; local_24 = local_24 + 1) {
      local_28 = -1;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI + 1,(long)local_24);
      for (local_2c = *pvVar4;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (in_RDI + 1,(long)(local_24 + 1)), local_2c < *pvVar4;
          local_2c = local_2c + 1) {
        std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)local_2c);
        bVar2 = HighsDomain::isFixed(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        if (bVar2) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)local_2c);
          local_28 = *pvVar4;
          break;
        }
      }
      if (local_28 != -1) {
        pvVar5 = HighsDomain::getDomainChangeStack((HighsDomain *)in_RSI);
        sVar6 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size(pvVar5);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)((long)in_RSI + 0x308),
                            (long)local_28);
        if ((*pvVar7 != 1.0) || (NAN(*pvVar7))) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI + 1,(long)local_24);
          local_48 = *pvVar4;
          while (in_stack_ffffffffffffff6c = local_48,
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (in_RDI + 1,(long)(local_24 + 1)),
                in_stack_ffffffffffffff6c < *pvVar4) {
            in_stack_ffffffffffffff60 = (HighsDomain *)((long)in_RSI + 800);
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)local_48);
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff60
                                ,(long)*pvVar4);
            if ((*pvVar7 != 0.0) || (NAN(*pvVar7))) {
              local_1c = local_1c + 1;
              pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)local_48);
              in_stack_ffffffffffffff5c = *pvVar4;
              HighsDomain::Reason::unspecified();
              HighsDomain::changeBound
                        ((HighsDomain *)
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                         (HighsBoundType)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                         (HighsInt)in_stack_ffffffffffffff60,
                         (double)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                         in_stack_ffffffffffffff70);
              bVar2 = HighsDomain::infeasible((HighsDomain *)in_RSI);
              if (bVar2) {
                return local_1c;
              }
            }
            local_48 = local_48 + 1;
          }
        }
        else {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI + 1,(long)local_24);
          for (local_3c = *pvVar4;
              pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (in_RDI + 1,(long)(local_24 + 1)), local_3c < *pvVar4;
              local_3c = local_3c + 1) {
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)local_3c);
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)((long)in_RSI + 0x308),
                                (long)*pvVar4);
            if ((*pvVar7 != 1.0) || (NAN(*pvVar7))) {
              local_1c = local_1c + 1;
              in_stack_ffffffffffffff70 = in_RSI;
              std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)local_3c);
              HighsDomain::Reason::unspecified();
              HighsDomain::changeBound
                        ((HighsDomain *)
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                         (HighsBoundType)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                         (HighsInt)in_stack_ffffffffffffff60,
                         (double)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                         in_stack_ffffffffffffff70);
              bVar2 = HighsDomain::infeasible((HighsDomain *)in_RSI);
              if (bVar2) {
                return local_1c;
              }
            }
          }
        }
        if (local_1c != iVar1) {
          HighsDomain::propagate(in_stack_000001e8);
          bVar2 = HighsDomain::infeasible((HighsDomain *)in_RSI);
          if (bVar2) {
            return local_1c;
          }
          pvVar5 = HighsDomain::getDomainChangeStack((HighsDomain *)in_RSI);
          sVar8 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size(pvVar5);
          if (local_1c - iVar1 < (int)sVar8 - (int)sVar6) {
            local_24 = -1;
          }
        }
      }
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

HighsInt StabilizerOrbits::orbitalFixing(HighsDomain& domain) const {
  HighsInt numFixed = symmetries->propagateOrbitopes(domain);
  if (domain.infeasible() || orbitCols.empty()) return numFixed;

  HighsInt numOrbits = orbitStarts.size() - 1;
  for (HighsInt i = 0; i < numOrbits; ++i) {
    HighsInt fixcol = -1;
    for (HighsInt j = orbitStarts[i]; j < orbitStarts[i + 1]; ++j) {
      if (domain.isFixed(orbitCols[j])) {
        fixcol = orbitCols[j];
        break;
      }
    }

    if (fixcol != -1) {
      HighsInt oldNumFixed = numFixed;
      auto oldSize = domain.getDomainChangeStack().size();
      if (domain.col_lower_[fixcol] == 1.0) {
        for (HighsInt j = orbitStarts[i]; j < orbitStarts[i + 1]; ++j) {
          if (domain.col_lower_[orbitCols[j]] == 1.0) continue;
          ++numFixed;
          domain.changeBound(HighsBoundType::kLower, orbitCols[j], 1.0,
                             HighsDomain::Reason::unspecified());
          if (domain.infeasible()) return numFixed;
        }
      } else {
        for (HighsInt j = orbitStarts[i]; j < orbitStarts[i + 1]; ++j) {
          if (domain.col_upper_[orbitCols[j]] == 0.0) continue;
          ++numFixed;
          domain.changeBound(HighsBoundType::kUpper, orbitCols[j], 0.0,
                             HighsDomain::Reason::unspecified());
          if (domain.infeasible()) return numFixed;
        }
      }

      HighsInt newFixed = numFixed - oldNumFixed;

      if (newFixed != 0) {
        domain.propagate();
        if (domain.infeasible()) return numFixed;
        if ((HighsInt)(domain.getDomainChangeStack().size() - oldSize) >
            newFixed)
          i = -1;
      }
    }
  }

  return numFixed;
}